

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

ssize_t __thiscall
FIX::ThreadedSocketConnection::send
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  socket_handle s;
  int iVar1;
  long lVar2;
  size_t length;
  ssize_t sVar3;
  ssize_t sent;
  ssize_t totalSent;
  string *msg_local;
  ThreadedSocketConnection *this_local;
  
  sent = 0;
  do {
    iVar1 = std::__cxx11::string::length();
    if (iVar1 <= sent) {
      this_local._7_1_ = 1;
LAB_002cebd6:
      return CONCAT71((int7)((ulong)sent >> 8),this_local._7_1_);
    }
    s = this->m_socket;
    lVar2 = std::__cxx11::string::c_str();
    length = std::__cxx11::string::length();
    sVar3 = socket_send(s,(char *)(lVar2 + sent),length);
    if (sVar3 < 0) {
      this_local._7_1_ = 0;
      sent = sVar3;
      goto LAB_002cebd6;
    }
    sent = sVar3 + sent;
  } while( true );
}

Assistant:

bool ThreadedSocketConnection::send(const std::string &msg) {
  ssize_t totalSent = 0;
  while (totalSent < (int)msg.length()) {
    ssize_t sent = socket_send(m_socket, msg.c_str() + totalSent, msg.length());
    if (sent < 0) {
      return false;
    }
    totalSent += sent;
  }

  return true;
}